

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.h
# Opt level: O0

void __thiscall
DatabaseName::DatabaseName
          (DatabaseName *this,path *db_base,string *type,string *id,string *filename)

{
  string *in_RCX;
  string *in_RDX;
  path *in_RDI;
  string *in_R8;
  path *ppVar1;
  
  ppVar1 = in_RDI;
  std::experimental::filesystem::v1::__cxx11::path::path(in_RDI,in_RDI);
  std::__cxx11::string::string((string *)(ppVar1 + 1),in_RDX);
  std::__cxx11::string::string((string *)&in_RDI[1]._M_cmpts,in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 2),in_R8);
  return;
}

Assistant:

DatabaseName(fs::path db_base, std::string type, std::string id,
                 std::string filename)
        : db_base(db_base), type(type), id(id), filename(filename) {}